

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,VertexShaderTestInstance *this)

{
  deUint32 _queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  RefBase<vk::VkCommandBuffer_s_*> local_148;
  RefBase<vk::Handle<(vk::HandleType)11>_> local_128;
  VkBuffer vertexBuffer;
  SharedPtr<vkt::Draw::Buffer> vertexBufferSp;
  VkDeviceSize vertexBufferOffset;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> renderPassClearValues;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  RenderPassBeginInfo renderPassBegin;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  
  vk = Context::getDeviceInterface
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  device = Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                     super_TestInstance.m_context);
  _queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,_queueFamilyIndex
             ,2);
  ::vk::createCommandPool
            (&cmdPool,vk,device,&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  makeQueryPool((Move<vk::Handle<(vk::HandleType)11>_> *)&renderPassBegin,vk,device,
                ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->queryStatisticFlags);
  local_128.m_data.deleter.m_device =
       (VkDevice)renderPassBegin.super_VkRenderPassBeginInfo.renderPass.m_internal;
  local_128.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassBegin.super_VkRenderPassBeginInfo.framebuffer.m_internal;
  local_128.m_data.object.m_internal = renderPassBegin.super_VkRenderPassBeginInfo._0_8_;
  local_128.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassBegin.super_VkRenderPassBeginInfo.pNext;
  renderPassBegin.super_VkRenderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBegin.super_VkRenderPassBeginInfo._4_4_ = 0;
  renderPassBegin.super_VkRenderPassBeginInfo.pNext = (void *)0x0;
  renderPassBegin.super_VkRenderPassBeginInfo.renderPass.m_internal = 0;
  renderPassBegin.super_VkRenderPassBeginInfo.framebuffer.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)11>_> *)&renderPassBegin);
  vertexBufferOffset = 0;
  GraphicBasicTestInstance::creatAndFillVertexBuffer((GraphicBasicTestInstance *)&vertexBufferSp);
  vertexBuffer.m_internal =
       ((vertexBufferSp.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
       object.m_internal;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&renderPassBegin,vk,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_148.m_data.deleter.m_device =
       (VkDevice)renderPassBegin.super_VkRenderPassBeginInfo.renderPass.m_internal;
  local_148.m_data.deleter.m_pool.m_internal =
       renderPassBegin.super_VkRenderPassBeginInfo.framebuffer.m_internal;
  local_148.m_data.object = (VkCommandBuffer_s *)renderPassBegin.super_VkRenderPassBeginInfo._0_8_;
  local_148.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassBegin.super_VkRenderPassBeginInfo.pNext;
  renderPassBegin.super_VkRenderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBegin.super_VkRenderPassBeginInfo._4_4_ = 0;
  renderPassBegin.super_VkRenderPassBeginInfo.pNext = (void *)0x0;
  renderPassBegin.super_VkRenderPassBeginInfo.renderPass.m_internal = 0;
  renderPassBegin.super_VkRenderPassBeginInfo.framebuffer.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&renderPassBegin);
  beginCommandBuffer(vk,local_148.m_data.object);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            (&renderPassClearValues,2,(allocator_type *)&renderPassBegin);
  memset(renderPassClearValues.
         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
         super__Vector_impl_data._M_start,0,
         ((long)renderPassClearValues.
                super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)renderPassClearValues.
               super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
               super__Vector_impl_data._M_start) * 0x10000000 >> 0x1c);
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            (&renderPassBegin,
             (VkRenderPass)
             (this->super_GraphicBasicTestInstance).m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
             (VkFramebuffer)
             (this->super_GraphicBasicTestInstance).m_framebuffer.
             super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal,
             (VkRect2D)(ZEXT816(0x4000000040) << 0x40),&renderPassClearValues);
  Draw::transition2DImage
            (vk,local_148.m_data.object,
             (VkImage)(((this->super_GraphicBasicTestInstance).m_colorAttachmentImage.m_ptr)->
                      m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,1,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,0,0x100);
  Draw::transition2DImage
            (vk,local_148.m_data.object,
             (VkImage)(((this->super_GraphicBasicTestInstance).m_depthImage.m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,2,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  (*vk->_vptr_DeviceInterface[0x70])
            (vk,local_148.m_data.object,local_128.m_data.object.m_internal,0,1);
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_148.m_data.object,&renderPassBegin,0);
  (*vk->_vptr_DeviceInterface[0x6e])
            (vk,local_148.m_data.object,local_128.m_data.object.m_internal,0,0);
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,local_148.m_data.object,0,1,&vertexBuffer,&vertexBufferOffset);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_148.m_data.object,0);
  (*(this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.super_TestInstance.
    _vptr_TestInstance[7])(this,local_148.m_data.object);
  (*vk->_vptr_DeviceInterface[0x6f])
            (vk,local_148.m_data.object,local_128.m_data.object.m_internal,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_148.m_data.object);
  Draw::transition2DImage
            (vk,local_148.m_data.object,
             (VkImage)(((this->super_GraphicBasicTestInstance).m_colorAttachmentImage.m_ptr)->
                      m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,1,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL,
             0,0x100);
  std::_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~_Vector_base
            (&renderPassBegin.m_clearValues.
              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>);
  std::_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~_Vector_base
            (&renderPassClearValues.
              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>);
  (*vk->_vptr_DeviceInterface[0x4a])(vk,local_148.m_data.object);
  submitCommandsAndWait(vk,device,queue,local_148.m_data.object);
  (*(this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.super_TestInstance.
    _vptr_TestInstance[6])(__return_storage_ptr__,this,local_128.m_data.object.m_internal);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_148);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&vertexBufferSp);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase(&local_128);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus VertexShaderTestInstance::executeTest (void)
{
	const DeviceInterface&					vk						= m_context.getDeviceInterface();
	const VkDevice							device					= m_context.getDevice();
	const VkQueue							queue					= m_context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const CmdPoolCreateInfo					cmdPoolCreateInfo		(queueFamilyIndex);
	const Move<VkCommandPool>				cmdPool					= createCommandPool(vk, device, &cmdPoolCreateInfo);
	const Unique<VkQueryPool>				queryPool				(makeQueryPool(vk, device, m_parametersGraphic.queryStatisticFlags));

	const VkDeviceSize						vertexBufferOffset		= 0u;
	const de::SharedPtr<Buffer>				vertexBufferSp			= creatAndFillVertexBuffer();
	const VkBuffer							vertexBuffer			= vertexBufferSp->object();

	const Unique<VkCommandBuffer>			cmdBuffer				(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);
	{
		const VkRect2D				renderArea				= { { 0, 0 }, { WIDTH, HEIGHT } };
		std::vector<VkClearValue>	renderPassClearValues	(2);
		deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(VkClearValue));
		const RenderPassBeginInfo	renderPassBegin			(*m_renderPass, *m_framebuffer, renderArea, renderPassClearValues);

		transition2DImage(vk, *cmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		transition2DImage(vk, *cmdBuffer, m_depthImage->object(), VK_IMAGE_ASPECT_DEPTH_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

		vk.cmdResetQueryPool(*cmdBuffer, *queryPool, 0u, 1u);

		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBegin, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBeginQuery(*cmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		vk.cmdBindVertexBuffers(*cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		draw(*cmdBuffer);
		vk.cmdEndQuery(*cmdBuffer, *queryPool, 0u);

		vk.cmdEndRenderPass(*cmdBuffer);

		transition2DImage(vk, *cmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL, 0u, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	}
	vk.endCommandBuffer(*cmdBuffer);

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	return checkResult (*queryPool);
}